

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_encryption_partially.c
# Opt level: O0

void test_read_format_zip_encryption_partially(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a_00;
  char *pcVar4;
  la_int64_t lVar5;
  la_ssize_t lVar6;
  undefined1 local_a8 [8];
  char buff [128];
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_16b4c;
  extract_reference_file("test_read_format_zip_encryption_partially.zip");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                   ,L'&',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'*',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a_00);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L',',-1,"ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW",(long)iVar1,
                      "archive_read_has_encrypted_entries(a)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'0',0x81b4,"(AE_IFREG | 0664)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
             ,L'1',"bar.txt","\"bar.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar5 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'2',0x14,"20",lVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'3',0,"0",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
  wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'4',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'5',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",a_00);
  lVar6 = archive_read_data((archive *)a_00,local_a8,0x80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'6',0x14,"20",lVar6,"archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L':',0x81b4,"(AE_IFREG | 0664)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
             ,L';',"foo.txt","\"foo.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar5 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'<',0x14,"20",lVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_data_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'=',1,"1",(long)wVar2,"archive_entry_is_data_encrypted(ae)",(void *)0x0);
  wVar2 = archive_entry_is_metadata_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'>',0,"0",(long)wVar2,"archive_entry_is_metadata_encrypted(ae)",(void *)0x0)
  ;
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'?',1,"1",(long)iVar1,"archive_read_has_encrypted_entries(a)",a_00);
  lVar6 = archive_read_data((archive *)a_00,local_a8,0x80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'@',-0x19,"ARCHIVE_FAILED",lVar6,"archive_read_data(a, buff, sizeof(buff))",
                      (void *)0x0);
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'B',2,"2",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'E',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_filter_code((archive *)a_00,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'H',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a_00);
  iVar1 = archive_format((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'I',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",a_00);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_encryption_partially.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_encryption_partially)
{
	/* This file contains one file that is encrypted (foo.txt, password=12345678)
	   and one file that is not encrypted (bar.txt) The header is not encrypted
	   on this file. */
	const char *refname = "test_read_format_zip_encryption_partially.zip";
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	assertEqualIntA(a, ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW, archive_read_has_encrypted_entries(a));

	/* Verify unencrypted file "bar.txt". */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0664), archive_entry_mode(ae));
	assertEqualString("bar.txt", archive_entry_pathname(ae));
	assertEqualInt(20, archive_entry_size(ae));
	assertEqualInt(0, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(20, archive_read_data(a, buff, sizeof(buff)));
	
	/* Verify encrypted file "foo.txt". */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0664), archive_entry_mode(ae));
	assertEqualString("foo.txt", archive_entry_pathname(ae));
	assertEqualInt(20, archive_entry_size(ae));
	assertEqualInt(1, archive_entry_is_data_encrypted(ae));
	assertEqualInt(0, archive_entry_is_metadata_encrypted(ae));
	assertEqualIntA(a, 1, archive_read_has_encrypted_entries(a));
	assertEqualInt(ARCHIVE_FAILED, archive_read_data(a, buff, sizeof(buff)));

	assertEqualInt(2, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}